

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS
ref_interp_convergence_rate
          (REF_DBL f3,REF_DBL h3,REF_DBL f2,REF_DBL h2,REF_DBL f1,REF_DBL h1,REF_DBL *rate)

{
  uint uVar1;
  bool bVar2;
  double __x;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double __x_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  
  *rate = -1.0;
  auVar8._0_8_ = f2 - f3;
  auVar8._8_8_ = f1 - f2;
  auVar9._8_8_ = -auVar8._8_8_;
  auVar9._0_8_ = -auVar8._0_8_;
  auVar9 = maxpd(auVar8,auVar9);
  dVar4 = auVar9._0_8_;
  __x = dVar4 / auVar9._8_8_;
  dVar3 = log(__x);
  dVar10 = auVar9._8_8_ * 1e+20;
  if (dVar10 <= -dVar10) {
    dVar10 = -dVar10;
  }
  if (dVar4 <= -dVar4) {
    dVar4 = -dVar4;
  }
  if (dVar4 < dVar10) {
    dVar10 = h2 / h1;
    uVar1 = 0;
    do {
      dVar4 = pow(dVar10,dVar3);
      dVar5 = pow(h3 / h2,dVar3);
      __x_00 = ((dVar4 + -1.0) / (dVar5 + -1.0)) * __x;
      dVar4 = log(dVar10);
      dVar5 = log(dVar10);
      dVar4 = *(double *)(&DAT_0021a5a0 + (ulong)(0.0 < dVar4 * 1e+20) * 8);
      dVar6 = log(__x_00);
      dVar7 = log(__x_00);
      if (dVar5 * dVar4 <=
          (double)(~-(ulong)(0.0 < dVar6) & (ulong)-dVar7 | -(ulong)(0.0 < dVar6) & (ulong)dVar7)) {
        return 0;
      }
      dVar4 = log(__x_00);
      dVar5 = log(dVar10);
      dVar4 = dVar3 * 0.5 + (dVar4 * 0.5) / dVar5;
      dVar3 = dVar4 - dVar3;
      if (dVar3 <= -dVar3) {
        dVar3 = -dVar3;
      }
    } while ((0.0001 <= dVar3) && (bVar2 = uVar1 < 0x13, dVar3 = dVar4, uVar1 = uVar1 + 1, bVar2));
    *rate = dVar4;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_interp_convergence_rate(REF_DBL f3, REF_DBL h3,
                                               REF_DBL f2, REF_DBL h2,
                                               REF_DBL f1, REF_DBL h1,
                                               REF_DBL *rate) {
  REF_DBL e12, e23, r12, r23;
  REF_DBL beta, omega = 0.5;
  REF_DBL p, last_p;
  REF_INT i;
  /*   AIAA JOURNAL Vol. 36, No. 5, May 1998
       Verification of Codes and Calculations
       Patrick J. Roache */
  /*
  f3 = a coarse grid numerical solution obtained with grid spacing h3
  f2 = a medium grid numerical solution obtained with grid spacing h2
  f1 = a fine grid numerical solution obtained with grid spacing h1
  */
  *rate = -1.0;
  e12 = ABS(f1 - f2);
  e23 = ABS(f2 - f3);
  r12 = h2 / h1;
  r23 = h3 / h2;
  p = log(e23 / e12);
  for (i = 0; i < 20; i++) {
    last_p = p;
    if (!ref_math_divisible(e23, e12)) return REF_SUCCESS;
    beta = ((pow(r12, p) - 1.0) / (pow(r23, p) - 1.0)) * (e23 / e12);
    if (!ref_math_divisible(log(beta), log(r12))) return REF_SUCCESS;
    p = omega * p + (1.0 - omega) * log(beta) / log(r12);
    if (ABS(p - last_p) < 0.0001) break;
  }
  *rate = p;
  return REF_SUCCESS;
}